

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian
          (BayesianProbitRegressor_Gaussian *this,BayesianProbitRegressor_Gaussian *from)

{
  void *pvVar1;
  double dVar2;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BayesianProbitRegressor_Gaussian_0034be98;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  dVar2 = from->precision_;
  this->mean_ = from->mean_;
  this->precision_ = dVar2;
  return;
}

Assistant:

BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian(const BayesianProbitRegressor_Gaussian& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&mean_, &from.mean_,
    reinterpret_cast<char*>(&precision_) -
    reinterpret_cast<char*>(&mean_) + sizeof(precision_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BayesianProbitRegressor.Gaussian)
}